

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service_base::reactor_op_cancellation::operator()
          (reactor_op_cancellation *this,cancellation_type_t type)

{
  bool bVar1;
  cancellation_type_t cVar2;
  cancellation_type_t in_ESI;
  void *in_stack_00000030;
  int in_stack_0000003c;
  per_descriptor_data *in_stack_00000040;
  socket_type in_stack_0000004c;
  epoll_reactor *in_stack_00000050;
  
  cVar2 = operator|(terminal,partial);
  cVar2 = operator|(cVar2,total);
  cVar2 = operator&(in_ESI,cVar2);
  bVar1 = operator!(cVar2);
  if (!bVar1) {
    epoll_reactor::cancel_ops_by_key
              (in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_0000003c,
               in_stack_00000030);
  }
  return;
}

Assistant:

void operator()(cancellation_type_t type)
    {
      if (!!(type &
            (cancellation_type::terminal
              | cancellation_type::partial
              | cancellation_type::total)))
      {
        reactor_->cancel_ops_by_key(descriptor_,
            *reactor_data_, op_type_, this);
      }
    }